

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Permutation *permutation)

{
  string local_30;
  
  if (Options::output_type == 1) {
    Permutation::ToLaTex_abi_cxx11_(&local_30,permutation);
    std::operator<<(out,(string *)&local_30);
  }
  else {
    if (Options::output_type != 0) {
      return out;
    }
    Permutation::ToString_abi_cxx11_(&local_30,permutation);
    std::operator<<(out,(string *)&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Permutation& permutation) {
  if (Options::output_type == Options::OutputType::Standard) {
    out << permutation.ToString();
  } else if (Options::output_type == Options::OutputType::LaTex) {
    out << permutation.ToLaTex();
  }

  return out;
}